

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O0

Preinstruction __thiscall
InstructionSet::M68k::Predecoder<(InstructionSet::M68k::Model)0>::decodeD
          (Predecoder<(InstructionSet::M68k::Model)0> *this,uint16_t instruction)

{
  ushort uVar1;
  uint16_t instruction_local;
  Predecoder<(InstructionSet::M68k::Model)0> *this_local;
  
  uVar1 = instruction & 0x1f0;
  if (uVar1 == 0x100) {
    this_local._4_4_ = decode<(unsigned_char)10,true>(this,instruction);
  }
  else if (uVar1 == 0x140) {
    this_local._4_4_ = decode<(unsigned_char)11,true>(this,instruction);
  }
  else if (uVar1 == 0x180) {
    this_local._4_4_ = decode<(unsigned_char)12,true>(this,instruction);
  }
  else {
    uVar1 = instruction & 0x1c0;
    if ((instruction & 0x1c0) == 0) {
      this_local._4_4_ = decode<(unsigned_char)180,true>(this,instruction);
    }
    else if (uVar1 == 0x40) {
      this_local._4_4_ = decode<(unsigned_char)181,true>(this,instruction);
    }
    else if (uVar1 == 0x80) {
      this_local._4_4_ = decode<(unsigned_char)182,true>(this,instruction);
    }
    else if (uVar1 == 0xc0) {
      this_local._4_4_ = decode<(unsigned_char)8,true>(this,instruction);
    }
    else if (uVar1 == 0x100) {
      this_local._4_4_ = decode<(unsigned_char)177,true>(this,instruction);
    }
    else if (uVar1 == 0x140) {
      this_local._4_4_ = decode<(unsigned_char)178,true>(this,instruction);
    }
    else if (uVar1 == 0x180) {
      this_local._4_4_ = decode<(unsigned_char)179,true>(this,instruction);
    }
    else if (uVar1 == 0x1c0) {
      this_local._4_4_ = decode<(unsigned_char)9,true>(this,instruction);
    }
    else {
      memset((void *)((long)&this_local + 4),0,4);
      Preinstruction::Preinstruction((Preinstruction *)((long)&this_local + 4));
    }
  }
  return this_local._4_4_;
}

Assistant:

Preinstruction Predecoder<model>::decodeD(uint16_t instruction) {
	using Op = Operation;

	switch(instruction & 0x1f0) {
		// 4-14 (p118)
		case 0x100:	Decode(Op::ADDXb);
		case 0x140:	Decode(Op::ADDXw);
		case 0x180:	Decode(Op::ADDXl);

		default:	break;
	}

	switch(instruction & 0x1c0) {
		// 4-7 (p111)
		case 0x0c0:	Decode(Op::ADDAw);
		case 0x1c0:	Decode(Op::ADDAl);

		// 4-4 (p108)
		case 0x000:	Decode(ADDtoRb);
		case 0x040:	Decode(ADDtoRw);
		case 0x080:	Decode(ADDtoRl);
		case 0x100:	Decode(ADDtoMb);
		case 0x140:	Decode(ADDtoMw);
		case 0x180:	Decode(ADDtoMl);

		default:	break;
	}

	return Preinstruction();
}